

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

ArrayPtr<void_*const> __thiscall kj::getStackTrace(kj *this,ArrayPtr<void_*> space,uint ignoreCount)

{
  int iVar1;
  ExceptionCallback *pEVar2;
  kj *pkVar3;
  long lVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  ArrayPtr<void_*const> AVar8;
  
  pEVar2 = getExceptionCallback();
  iVar1 = (*pEVar2->_vptr_ExceptionCallback[5])(pEVar2);
  sVar6 = 0;
  pkVar3 = (kj *)0x0;
  if (iVar1 != 2) {
    iVar1 = backtrace(this,(ulong)space.ptr & 0xffffffff);
    uVar5 = (ulong)iVar1;
    for (lVar4 = 0; uVar5 * 8 - lVar4 != 0; lVar4 = lVar4 + 8) {
      *(long *)(this + lVar4) = *(long *)(this + lVar4) + -1;
    }
    uVar7 = (ulong)((int)space.size_ + 1);
    if (uVar5 < uVar7) {
      uVar7 = uVar5;
    }
    pkVar3 = this + uVar7 * 8;
    sVar6 = uVar5 - uVar7;
  }
  AVar8.size_ = sVar6;
  AVar8.ptr = (void **)pkVar3;
  return AVar8;
}

Assistant:

ArrayPtr<void* const> getStackTrace(ArrayPtr<void*> space, uint ignoreCount) {
  if (getExceptionCallback().stackTraceMode() == ExceptionCallback::StackTraceMode::NONE) {
    return nullptr;
  }

#if _WIN32 && _M_X64
  CONTEXT context;
  RtlCaptureContext(&context);
  return getStackTrace(space, ignoreCount, GetCurrentThread(), context);
#elif KJ_HAS_BACKTRACE
  size_t size = backtrace(space.begin(), space.size());
  for (auto& addr: space.slice(0, size)) {
    // The addresses produced by backtrace() are return addresses, which means they point to the
    // instruction immediately after the call. Invoking addr2line on these can be confusing because
    // it often points to the next line. If the next instruction is inlined from another function,
    // the trace can be extra-confusing, since now it claims to be in a function that was not
    // actually on the call stack. If we subtract 1 from each address, though, we get a much more
    // reasonable trace. This may cause the addresses to be invalid instruction pointers if the
    // instructions were multi-byte, but it appears addr2line is able to cope with this.
    addr = reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(addr) - 1);
  }
  return space.slice(kj::min(ignoreCount + 1, size), size);
#else
  return nullptr;
#endif
}